

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

bool __thiscall QueueJobLess::operator()(QueueJobLess *this,QueueJob *__x,QueueJob *__y)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  StringRef LHS;
  StringRef RHS;
  
  iVar2 = (*__x->desc->_vptr_JobDescriptor[2])();
  LHS.Data._4_4_ = extraout_var;
  LHS.Data._0_4_ = iVar2;
  iVar2 = (*__y->desc->_vptr_JobDescriptor[2])();
  RHS.Data._4_4_ = extraout_var_00;
  RHS.Data._0_4_ = iVar2;
  LHS.Length = extraout_RDX;
  RHS.Length = extraout_RDX_00;
  bVar1 = llvm::operator<(LHS,RHS);
  return bVar1;
}

Assistant:

bool operator()(const llbuild::basic::QueueJob &__x,
                  const llbuild::basic::QueueJob &__y) const {
    return __x.getDescriptor()->getOrdinalName() <
            __y.getDescriptor()->getOrdinalName();
  }